

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O2

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::triangle
          (ImGuiDrawListGraphicsAdaptor *this,float x1,float y1,float x2,float y2,float x3,float y3,
          bool fill,color *c)

{
  ImDrawList *this_00;
  ImU32 IVar1;
  undefined7 in_register_00000031;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec4 local_30;
  
  this_00 = this->draw_list;
  local_48.x = x3;
  local_48.y = y3;
  local_40.x = x2;
  local_40.y = y2;
  local_38.x = x1;
  local_38.y = y1;
  if ((int)CONCAT71(in_register_00000031,fill) == 0) {
    local_30.x = *c->r;
    local_30.y = *c->g;
    local_30.z = *c->b;
    local_30.w = *c->a;
    IVar1 = ImGui::ColorConvertFloat4ToU32(&local_30);
    ImDrawList::AddTriangle(this_00,&local_38,&local_40,&local_48,IVar1,1.0);
  }
  else {
    local_30.x = *c->r;
    local_30.y = *c->g;
    local_30.z = *c->b;
    local_30.w = *c->a;
    IVar1 = ImGui::ColorConvertFloat4ToU32(&local_30);
    ImDrawList::AddTriangleFilled(this_00,&local_38,&local_40,&local_48,IVar1);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::triangle(float x1, float y1, float x2,
                                            float y2, float x3, float y3,
                                            bool fill, const color::color& c) {
    if (fill) {
        draw_list->AddTriangleFilled(ImVec2(x1, y1), ImVec2(x2, y2),
                                     ImVec2(x3, y3),
                                     ImColor(c.r, c.g, c.b, c.a));
    } else {
        draw_list->AddTriangle(ImVec2(x1, y1), ImVec2(x2, y2), ImVec2(x3, y3),
                               ImColor(c.r, c.g, c.b, c.a));
    }
}